

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

void __thiscall om::concurrency::thread_pool::_worker_thread(thread_pool *this)

{
  bool bVar1;
  undefined1 local_30 [8];
  function<void_()> task;
  thread_pool *this_local;
  
  task._M_invoker = (_Invoker_type)this;
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::function<void_()>::function((function<void_()> *)local_30);
    bVar1 = queue<std::function<void_()>_>::dequeue
                      (&this->_task_queue,(function<void_()> *)local_30);
    if (bVar1) {
      std::function<void_()>::operator()((function<void_()> *)local_30);
    }
    else {
      std::this_thread::yield();
    }
    std::function<void_()>::~function((function<void_()> *)local_30);
  }
  return;
}

Assistant:

void _worker_thread()
			{
				while (!_done) {
					std::function<void()> task;

					if (_task_queue.dequeue(task)) {
						task();
					} else {
						std::this_thread::yield();
					}
				}
			}